

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void transfer_file_data(mg_connection *nc)

{
  size_t sVar1;
  mbuf *local_1060;
  mbuf *local_1058;
  size_t n_1;
  size_t to_write;
  mbuf *io_1;
  mbuf *io;
  size_t to_read;
  size_t n;
  int64_t left;
  char buf [4096];
  proto_data_http *dp;
  mg_connection *nc_local;
  
  buf._4088_8_ = nc->proto_data;
  local_1060 = (mbuf *)(*(long *)(buf._4088_8_ + 8) - *(long *)(buf._4088_8_ + 0x10));
  io = (mbuf *)0x0;
  if (*(int *)(buf._4088_8_ + 0x28) == 1) {
    if ((nc->send_mbuf).len < 0x1000) {
      io = (mbuf *)(0x1000 - (nc->send_mbuf).len);
    }
    if ((0 < (long)local_1060) && (local_1060 < io)) {
      io = local_1060;
    }
    if (io != (mbuf *)0x0) {
      if ((*(long *)(buf._4088_8_ + 0x10) < *(long *)(buf._4088_8_ + 8)) &&
         (sVar1 = fread(&left,1,(size_t)io,*(FILE **)buf._4088_8_), sVar1 != 0)) {
        mg_send(nc,&left,(int)sVar1);
        *(size_t *)(buf._4088_8_ + 0x10) = sVar1 + *(long *)(buf._4088_8_ + 0x10);
      }
      else {
        free_http_proto_data(nc);
      }
    }
  }
  else if (*(int *)(buf._4088_8_ + 0x28) == 2) {
    if ((long)local_1060 < 1) {
      local_1058 = (mbuf *)0x0;
    }
    else {
      if ((long)(nc->recv_mbuf).len <= (long)local_1060) {
        local_1060 = (mbuf *)(nc->recv_mbuf).len;
      }
      local_1058 = local_1060;
    }
    sVar1 = fwrite((nc->recv_mbuf).buf,1,(size_t)local_1058,*(FILE **)buf._4088_8_);
    if (sVar1 != 0) {
      mbuf_remove(&nc->recv_mbuf,sVar1);
      *(size_t *)(buf._4088_8_ + 0x10) = sVar1 + *(long *)(buf._4088_8_ + 0x10);
      if (*(long *)(buf._4088_8_ + 0x10) < *(long *)(buf._4088_8_ + 8)) {
        return;
      }
    }
    free_http_proto_data(nc);
  }
  else if (*(int *)(buf._4088_8_ + 0x28) == 3) {
    if (*(long *)(buf._4088_8_ + 0x20) == 0) {
      nc->flags = nc->flags | 0x400;
    }
    else {
      mg_forward(nc,*(mg_connection **)(buf._4088_8_ + 0x20));
    }
  }
  return;
}

Assistant:

static void transfer_file_data(struct mg_connection *nc) {
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;
    char buf[MG_MAX_HTTP_SEND_IOBUF];
    int64_t left = dp->cl - dp->sent;
    size_t n = 0, to_read = 0;

    if (dp->type == DATA_FILE) {
        struct mbuf *io = &nc->send_mbuf;
        if (io->len < sizeof(buf)) {
            to_read = sizeof(buf) - io->len;
        }

        if (left > 0 && to_read > (size_t) left) {
            to_read = left;
        }

        if (to_read == 0) {
            /* Rate limiting. send_mbuf is too full, wait until it's drained. */
        } else if (dp->sent < dp->cl && (n = fread(buf, 1, to_read, dp->fp)) > 0) {
            mg_send(nc, buf, n);
            dp->sent += n;
        } else {
            free_http_proto_data(nc);
#ifdef MG_DISABLE_HTTP_KEEP_ALIVE
            nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
        }
    } else if (dp->type == DATA_PUT) {
        struct mbuf *io = &nc->recv_mbuf;
        size_t to_write =
                left <= 0 ? 0 : left < (int64_t) io->len ? (size_t) left : io->len;
        size_t n = fwrite(io->buf, 1, to_write, dp->fp);
        if (n > 0) {
            mbuf_remove(io, n);
            dp->sent += n;
        }
        if (n == 0 || dp->sent >= dp->cl) {
            free_http_proto_data(nc);
#ifdef MG_DISABLE_HTTP_KEEP_ALIVE
            nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
        }
    } else if (dp->type == DATA_CGI) {
        /* This is POST data that needs to be forwarded to the CGI process */
        if (dp->cgi_nc != NULL) {
            mg_forward(nc, dp->cgi_nc);
        } else {
            nc->flags |= MG_F_SEND_AND_CLOSE;
        }
    }
}